

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_binary.cpp
# Opt level: O1

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseBinary
          (Parser *this,unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *lhs,
          Precedence minPrecedence)

{
  byte bVar1;
  TokenType TVar2;
  SyntaxErrorCode SVar3;
  Lexer *pLVar4;
  long *plVar5;
  Token *pTVar6;
  Expr *pEVar7;
  pointer pcVar8;
  pointer pcVar9;
  istream *piVar10;
  Parser *this_00;
  _Head_base<0UL,_pfederc::Expr_*,_false> _Var11;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *puVar12;
  undefined8 uVar13;
  bool bVar14;
  long *plVar15;
  UnOpExpr *this_01;
  mapped_type *pmVar16;
  mapped_type *pmVar17;
  BiOpExpr *this_02;
  mapped_type *pmVar18;
  undefined2 uVar19;
  undefined4 in_ECX;
  undefined7 in_register_00000011;
  undefined8 extraout_RDX;
  pointer __p;
  long *plVar20;
  Lexer *pLVar21;
  TokenType optype;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> rhs;
  TokenType local_b2;
  _Head_base<0UL,_pfederc::Expr_*,_false> local_b0;
  Lexer *local_a8;
  _Head_base<0UL,_pfederc::Expr_*,_false> local_a0;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *local_98;
  undefined1 local_90 [32];
  pointer local_70;
  byte local_64;
  _Base_ptr local_60;
  Position local_58;
  undefined1 local_40 [16];
  
  local_98 = (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
             CONCAT71(in_register_00000011,minPrecedence);
  pLVar21 = (lhs->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
            _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl[3].lexer;
  local_60 = (_Base_ptr)0x0;
  local_a0._M_head_impl = (Expr *)this;
  _local_64 = in_ECX;
  do {
    TVar2 = *(TokenType *)&pLVar21->input;
    if (((ulong)TVar2 < 0x2d) && ((0x1000001c0006U >> ((ulong)TVar2 & 0x3f) & 1) != 0)) {
      bVar14 = false;
    }
    else {
      bVar14 = isTokenTypeOperator(TVar2);
      uVar19 = 0x42;
      if (bVar14) {
        uVar19 = *(undefined2 *)&pLVar21->input;
      }
      local_90._0_2_ = uVar19;
      pmVar16 = std::__detail::
                _Map_base<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)OPERATORS_INFO,(key_type *)local_90);
      bVar1 = (pmVar16->
              super__Tuple_impl<0UL,_unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>).
              super__Head_base<0UL,_unsigned_char,_false>._M_head_impl;
      local_60 = (_Base_ptr)CONCAT71((int7)((ulong)extraout_RDX >> 8),bVar1);
      bVar14 = local_64 <= bVar1 &&
               (pmVar16->
               super__Tuple_impl<0UL,_unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>)
               .super__Tuple_impl<1UL,_pfederc::OperatorType,_pfederc::Associativity>.
               super__Head_base<1UL,_pfederc::OperatorType,_false>._M_head_impl == BINARY;
    }
    if (!bVar14) {
      *(Expr **)local_a0._M_head_impl =
           (local_98->_M_t).
           super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
           super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
           super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
      (local_98->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
      _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
      return (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)local_a0._M_head_impl;
    }
    pLVar4 = (lhs->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
             super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl[3].lexer;
    bVar14 = isTokenTypeOperator(*(TokenType *)&pLVar4->input);
    local_b2 = TOK_OP_NONE;
    if (bVar14) {
      local_b2 = *(TokenType *)&pLVar4->input;
    }
    if (local_b2 != TOK_OP_NONE) goto LAB_001118af;
    while (bVar14 = Token::operator==((Token *)(lhs->_M_t).
                                               super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                               .super__Head_base<0UL,_pfederc::Expr_*,_false>.
                                               _M_head_impl[3].lexer,TOK_EOL), bVar14) {
LAB_001118af:
      Lexer::next((Lexer *)(lhs->_M_t).
                           super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                           .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl);
    }
    local_b0._M_head_impl = (Expr *)0x0;
    plVar5 = *(long **)(TOKEN_BRACKETS + ((ulong)local_b2 % DAT_0012c3c8 & 0xffffffff) * 8);
    plVar15 = (long *)0x0;
    if ((plVar5 != (long *)0x0) &&
       (plVar15 = plVar5, plVar20 = (long *)*plVar5, local_b2 != *(TokenType *)((long *)*plVar5 + 1)
       )) {
      while (plVar5 = (long *)*plVar20, plVar5 != (long *)0x0) {
        plVar15 = (long *)0x0;
        if (((ulong)*(TokenType *)(plVar5 + 1) % DAT_0012c3c8 != (ulong)local_b2 % DAT_0012c3c8) ||
           (plVar15 = plVar20, plVar20 = plVar5, local_b2 == *(TokenType *)(plVar5 + 1)))
        goto LAB_0011192b;
      }
      plVar15 = (long *)0x0;
    }
LAB_0011192b:
    if ((plVar15 == (long *)0x0) || (*plVar15 == 0)) {
      local_58.line = 0;
      parsePrimary((Parser *)local_90,
                   (unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *
                   )lhs);
      uVar13 = local_90._0_8_;
      _Var11._M_head_impl = local_b0._M_head_impl;
      local_90._0_8_ = (Lexer *)0x0;
      local_b0._M_head_impl = (Expr *)uVar13;
      if ((Lexer *)_Var11._M_head_impl != (Lexer *)0x0) {
        (*(_Var11._M_head_impl)->_vptr_Expr[1])();
      }
      if ((Lexer *)local_90._0_8_ != (Lexer *)0x0) {
        (*(*(_func_int ***)local_90._0_8_)[1])();
      }
      local_90._0_8_ = (Lexer *)0x0;
      local_a8 = pLVar4;
      std::unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>::
      ~unique_ptr((unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *)
                  &local_58);
      if ((Lexer *)local_b0._M_head_impl != (Lexer *)0x0) {
        do {
          pLVar21 = (lhs->_M_t).
                    super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
                    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl[3].lexer;
          TVar2 = *(TokenType *)&pLVar21->input;
          if (((ulong)TVar2 < 0x2d) && ((0x1000001c0006U >> ((ulong)TVar2 & 0x3f) & 1) != 0)) {
LAB_00111aa7:
            bVar14 = false;
          }
          else {
            bVar14 = isTokenTypeOperator(TVar2);
            uVar19 = 0x42;
            if (bVar14) {
              uVar19 = *(undefined2 *)&pLVar21->input;
            }
            local_90._0_2_ = uVar19;
            pmVar16 = std::__detail::
                      _Map_base<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::at((_Map_base<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)OPERATORS_INFO,(key_type *)local_90);
            bVar1 = (pmVar16->
                    super__Tuple_impl<0UL,_unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>
                    ).super__Head_base<0UL,_unsigned_char,_false>._M_head_impl;
            if ((pmVar16->
                super__Tuple_impl<0UL,_unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>
                ).super__Tuple_impl<1UL,_pfederc::OperatorType,_pfederc::Associativity>.
                super__Head_base<1UL,_pfederc::OperatorType,_false>._M_head_impl != BINARY)
            goto LAB_00111aa7;
            bVar14 = true;
            if (bVar1 <= (byte)local_60) {
              if (bVar1 != (byte)local_60) goto LAB_00111aa7;
              bVar14 = (pmVar16->
                       super__Tuple_impl<0UL,_unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>
                       ).super__Tuple_impl<1UL,_pfederc::OperatorType,_pfederc::Associativity>.
                       super__Tuple_impl<2UL,_pfederc::Associativity>.
                       super__Head_base<2UL,_pfederc::Associativity,_false>._M_head_impl == RIGHT;
            }
          }
          if (!bVar14) goto LAB_00111bec;
          local_70 = (pointer)local_b0._M_head_impl;
          local_b0._M_head_impl = (Expr *)0x0;
          parseBinary((Parser *)local_90,lhs,(Precedence)&local_70);
          uVar13 = local_90._0_8_;
          _Var11._M_head_impl = local_b0._M_head_impl;
          local_90._0_8_ = (Lexer *)0x0;
          local_b0._M_head_impl = (Expr *)uVar13;
          if (_Var11._M_head_impl != (Expr *)0x0) {
            (*(_Var11._M_head_impl)->_vptr_Expr[1])();
          }
          local_90._0_8_ = (Lexer *)0x0;
          if ((Lexer *)local_70 != (Lexer *)0x0) {
            (*(*(_func_int ***)&local_70->_M_t)[1])();
          }
          local_70 = (pointer)0x0;
        } while( true );
      }
      local_90._0_8_ = operator_new(0x38);
      pcVar9 = (local_a8->filePath)._M_dataplus._M_p;
      piVar10 = (istream *)(local_a8->filePath)._M_string_length;
      pcVar8 = (pointer)(local_a8->filePath).field_2._M_allocated_capacity;
      *(Level *)&((Lexer *)local_90._0_8_)->_vptr_Lexer = LVL_ERROR;
      *(SyntaxErrorCode *)((long)&((Lexer *)local_90._0_8_)->_vptr_Lexer + 4) =
           STX_ERR_EXPECTED_PRIMARY_EXPR;
      ((Position *)&((Lexer *)local_90._0_8_)->cfg)->line = (size_t)pcVar9;
      ((Lexer *)local_90._0_8_)->input = piVar10;
      (((Lexer *)local_90._0_8_)->filePath)._M_dataplus._M_p = pcVar8;
      (((Lexer *)local_90._0_8_)->filePath)._M_string_length = 0;
      (((Lexer *)local_90._0_8_)->filePath).field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(((Lexer *)local_90._0_8_)->filePath).field_2 + 8) = 0;
      generateError((Parser *)local_40,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)lhs);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 local_40);
      this_00 = (Parser *)local_90;
      pLVar4 = (Lexer *)local_90._0_8_;
joined_r0x00111cd5:
      if (pLVar4 != (Lexer *)0x0) {
        std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                  ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)this_00,
                   (Error<pfederc::SyntaxErrorCode> *)pLVar4);
      }
LAB_00111d9f:
      (local_a0._M_head_impl)->_vptr_Expr = (_func_int **)0x0;
      bVar14 = true;
    }
    else if ((local_b2 == TOK_OP_BRACKET_OPEN) &&
            (bVar14 = Token::operator==((Token *)(lhs->_M_t).
                                                 super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                                 .super__Head_base<0UL,_pfederc::Expr_*,_false>.
                                                 _M_head_impl[3].lexer,TOK_BRACKET_CLOSE), bVar14))
    {
      pLVar21 = (Lexer *)(lhs->_M_t).
                         super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                         .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
      pTVar6 = pLVar21->currentToken;
      Lexer::next(pLVar21);
      local_a8 = (Lexer *)(lhs->_M_t).
                          super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                          .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
      Position::operator+(&local_58,
                          &((local_98->_M_t).
                            super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                            .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->pos,
                          (Position *)&pLVar4->filePath);
      Position::operator+((Position *)local_90,&local_58,&pTVar6->pos);
      this_01 = (UnOpExpr *)operator_new(0x48);
      puVar12 = local_98;
      UnOpExpr::UnOpExpr(this_01,local_a8,(Position *)local_90,(Token *)pLVar4,local_98);
      local_90._24_8_ = (Lexer *)0x0;
      pEVar7 = (puVar12->_M_t).
               super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
               super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
               super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
      (puVar12->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t
      .super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)this_01;
      if (pEVar7 != (Expr *)0x0) {
        (*pEVar7->_vptr_Expr[1])();
      }
      std::unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> *)
                 (local_90 + 0x18));
      pLVar21 = (lhs->_M_t).
                super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
                super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl[3].lexer;
      bVar14 = false;
    }
    else {
      parseExpression((Parser *)local_90,(Precedence)lhs);
      uVar13 = local_90._0_8_;
      _Var11._M_head_impl = local_b0._M_head_impl;
      local_90._0_8_ = (Lexer *)0x0;
      local_b0._M_head_impl = (Expr *)uVar13;
      if ((Lexer *)_Var11._M_head_impl != (Lexer *)0x0) {
        (*(_Var11._M_head_impl)->_vptr_Expr[1])();
      }
      if ((Lexer *)local_90._0_8_ != (Lexer *)0x0) {
        (*(*(_func_int ***)local_90._0_8_)[1])();
      }
      if ((Lexer *)local_b0._M_head_impl == (Lexer *)0x0) goto LAB_00111d9f;
      local_a8 = pLVar4;
      pmVar17 = std::__detail::
                _Map_base<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::TokenType>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::TokenType>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&TOKEN_BRACKETS,&local_b2);
      bVar14 = expect((Parser *)lhs,*pmVar17);
      if (!bVar14) {
        pmVar18 = std::
                  map<pfederc::TokenType,_pfederc::SyntaxErrorCode,_std::less<pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::SyntaxErrorCode>_>_>
                  ::at((map<pfederc::TokenType,_pfederc::SyntaxErrorCode,_std::less<pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::SyntaxErrorCode>_>_>
                        *)STX_ERR_BRACKETS,&local_b2);
        Position::operator+(&local_58,(Position *)&local_a8->filePath,&(local_b0._M_head_impl)->pos)
        ;
        Position::operator+((Position *)local_90,&local_58,
                            (Position *)
                            &((lhs->_M_t).
                              super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                              .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl[3].lexer)
                             ->filePath);
        local_90._24_8_ = operator_new(0x38);
        SVar3 = *pmVar18;
        *(Level *)&((Lexer *)local_90._24_8_)->_vptr_Lexer = LVL_ERROR;
        *(SyntaxErrorCode *)((long)&((Lexer *)local_90._24_8_)->_vptr_Lexer + 4) = SVar3;
        ((Position *)&((Lexer *)local_90._24_8_)->cfg)->line = local_90._0_8_;
        ((Lexer *)local_90._24_8_)->input = (istream *)local_90._8_8_;
        (((Lexer *)local_90._24_8_)->filePath)._M_dataplus._M_p = (pointer)local_90._16_8_;
        (((Lexer *)local_90._24_8_)->filePath)._M_string_length = 0;
        (((Lexer *)local_90._24_8_)->filePath).field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&(((Lexer *)local_90._24_8_)->filePath).field_2 + 8) = 0;
        this_00 = (Parser *)(local_90 + 0x18);
        generateError((Parser *)(local_40 + 8),
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)lhs);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   (local_40 + 8));
        pLVar4 = (Lexer *)local_90._24_8_;
        goto joined_r0x00111cd5;
      }
      pLVar21 = (lhs->_M_t).
                super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
                super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl[3].lexer;
LAB_00111bec:
      pLVar4 = (Lexer *)(lhs->_M_t).
                        super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                        .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
      Position::operator+((Position *)local_90,
                          &((local_98->_M_t).
                            super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                            .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->pos,
                          &(local_b0._M_head_impl)->pos);
      this_02 = (BiOpExpr *)operator_new(0x58);
      puVar12 = local_98;
      BiOpExpr::BiOpExpr(this_02,pLVar4,(Position *)local_90,(Token *)local_a8,local_b2,local_98,
                         (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&local_b0
                        );
      local_58.line = 0;
      pEVar7 = (puVar12->_M_t).
               super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
               super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
               super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
      (puVar12->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t
      .super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)this_02;
      if (pEVar7 != (Expr *)0x0) {
        (*pEVar7->_vptr_Expr[1])();
      }
      std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_> *)&local_58
                );
      bVar14 = false;
    }
    if ((Lexer *)local_b0._M_head_impl != (Lexer *)0x0) {
      (*(local_b0._M_head_impl)->_vptr_Expr[1])();
    }
    if (bVar14) {
      return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
             (tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)local_a0._M_head_impl;
    }
  } while( true );
}

Assistant:

std::unique_ptr<Expr> Parser::parseBinary(std::unique_ptr<Expr> lhs,
    Precedence minPrecedence) noexcept {
  Precedence prec{0};
  Token *lookahead = lexer.getCurrentToken();
  while (_binary_continue_condition(*lookahead, minPrecedence, prec)) {
    const Token *op = lexer.getCurrentToken();
    TokenType optype = _getOperatorType(*op);
    if (optype != TokenType::TOK_OP_NONE)
      lexer.next(); // advance to next unprocessed token
    
    // ignore newline tokens
    while (*lexer.getCurrentToken() == TokenType::TOK_EOL)
      lexer.next();

    std::unique_ptr<Expr> rhs;
    if (TOKEN_BRACKETS.find(optype) != TOKEN_BRACKETS.end()) {
      if (optype == TokenType::TOK_OP_BRACKET_OPEN
          && *lexer.getCurrentToken() == TokenType::TOK_BRACKET_CLOSE) {
        // empty function call, because ()
        const Token *const closingBracket = lexer.getCurrentToken();
        lexer.next(); // eat )
        lhs = std::make_unique<UnOpExpr>(lexer,
          lhs->getPosition() + op->getPosition() + closingBracket->getPosition(),
          op, std::move(lhs));

        lookahead = lexer.getCurrentToken();

        continue;
      } else {
        rhs = parseExpression();
        if (!rhs)
          return nullptr;

        if (!expect(TOKEN_BRACKETS.at(optype))) {
          generateError(std::make_unique<SyntaxError>(LVL_ERROR,
            STX_ERR_BRACKETS.at(optype),
            op->getPosition() + rhs->getPosition() +
            lexer.getCurrentToken()->getPosition()));
          return nullptr;
        }
      }

      lookahead = lexer.getCurrentToken();
    } else {
      rhs = parsePrimary();
      if (!rhs) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_PRIMARY_EXPR, op->getPosition()));
          
        return nullptr;
      }

      // lexer already on unprocessed token
      lookahead = lexer.getCurrentToken();
      Precedence innerPrec{0};
      while (_binary_inner_continue_condition(*lookahead, prec, innerPrec)) {
        rhs = parseBinary(std::move(rhs), innerPrec);
        lookahead = lexer.getCurrentToken();
      }
    }

    lhs = std::make_unique<BiOpExpr>(lexer,
      lhs->getPosition() + rhs->getPosition(),
      op, optype, std::move(lhs), std::move(rhs));
  }

  return lhs;
}